

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void state_clear(apx_parse_state_t *self)

{
  self->accept_next = '\0';
  self->lineno = 0;
  self->major_version = 0;
  self->minor_version = 0;
  if (self->node != (apx_node_t *)0x0) {
    apx_node_delete(self->node);
    self->node = (apx_node_t *)0x0;
  }
  self->data_element = (apx_dataElement_t *)0x0;
  self->data_type = (apx_dataType_t *)0x0;
  self->port = (apx_port_t *)0x0;
  return;
}

Assistant:

static void state_clear(apx_parse_state_t* self)
{
   self->accept_next = APX_DEFINITION_SECTION_VERSION;
   self->lineno = 0;
   self->major_version = 0;
   self->minor_version = 0;
   if (self->node != NULL)
   {
      apx_node_delete(self->node);
      self->node = NULL;
   }
   self->data_element = NULL;
   self->data_type = NULL;
   self->port = NULL;
}